

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

void __thiscall cmCTestSubmitHandler::Initialize(cmCTestSubmitHandler *this)

{
  this->SubmitPart[0] = true;
  this->SubmitPart[1] = true;
  this->SubmitPart[2] = true;
  this->SubmitPart[3] = true;
  this->SubmitPart[4] = true;
  this->SubmitPart[5] = true;
  this->SubmitPart[6] = true;
  this->SubmitPart[7] = true;
  this->SubmitPart[8] = true;
  this->SubmitPart[9] = true;
  this->SubmitPart[10] = true;
  this->SubmitPart[0xb] = true;
  this->HasWarnings = false;
  this->HasErrors = false;
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  (this->HTTPProxy)._M_string_length = 0;
  *(this->HTTPProxy)._M_dataplus._M_p = '\0';
  this->HTTPProxyType = 0;
  (this->HTTPProxyAuth)._M_string_length = 0;
  *(this->HTTPProxyAuth)._M_dataplus._M_p = '\0';
  this->LogFile = (ostream *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->Files)._M_t);
  return;
}

Assistant:

void cmCTestSubmitHandler::Initialize()
{
  // We submit all available parts by default.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = cmCTest::Part(p + 1)) {
    this->SubmitPart[p] = true;
  }
  this->HasWarnings = false;
  this->HasErrors = false;
  this->Superclass::Initialize();
  this->HTTPProxy.clear();
  this->HTTPProxyType = 0;
  this->HTTPProxyAuth.clear();
  this->LogFile = nullptr;
  this->Files.clear();
}